

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Resupply_Received_PDU::~Resupply_Received_PDU(Resupply_Received_PDU *this)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  
  (this->super_Logistics_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Resupply_Received_PDU_00223f40;
  pSVar1 = (this->m_vSupplies).
           super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_vSupplies).
           super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar3 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      (**(pSVar3->super_EntityType).super_DataTypeBase._vptr_DataTypeBase)(pSVar3);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar2);
    (this->m_vSupplies).
    super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::~vector
            (&this->m_vSupplies);
  Logistics_Header::~Logistics_Header(&this->super_Logistics_Header);
  return;
}

Assistant:

Resupply_Received_PDU::~Resupply_Received_PDU()
{
    m_vSupplies.clear();
}